

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

void __thiscall asmjit::ZoneHashBase::_rehash(ZoneHashBase *this,uint32_t newCount)

{
  ZoneHeap *pZVar1;
  Slot *p;
  Slot SVar2;
  uint uVar3;
  ZoneHashNode **ppZVar4;
  ulong uVar5;
  size_t extraout_RDX;
  ulong size;
  ulong uVar6;
  Slot SVar7;
  size_t sStack_28;
  
  pZVar1 = this->_heap;
  if (pZVar1 == (ZoneHeap *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/zone.cpp"
               ,0x2a0,"isInitialized()");
  }
  if (pZVar1->_zone == (Zone *)0x0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
               ,0x198,"isInitialized()");
  }
  p = (Slot *)this->_data;
  ppZVar4 = (ZoneHashNode **)ZoneHeap::_allocZeroed(pZVar1,(ulong)newCount << 3,&sStack_28);
  if (ppZVar4 != (ZoneHashNode **)0x0) {
    uVar3 = this->_bucketsCount;
    uVar5 = (ulong)uVar3;
    size = extraout_RDX;
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      SVar7.next = (Slot *)p[uVar6].next;
      while ((ZoneHashNode *)SVar7.next != (ZoneHashNode *)0x0) {
        SVar2.next = (SVar7.next)->next;
        size = (ulong)*(uint *)((long)SVar7.next + 8) % (ulong)newCount;
        *SVar7.next = (Slot *)ppZVar4[size];
        ppZVar4[size] = (ZoneHashNode *)SVar7.next;
        SVar7.next = SVar2.next;
      }
    }
    if (p != (Slot *)this->_embedded) {
      pZVar1 = this->_heap;
      if (pZVar1->_zone == (Zone *)0x0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                   ,0x1af,"isInitialized()");
      }
      if (p == (Slot *)0x0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                   ,0x1b1,"p != nullptr");
      }
      if (uVar5 == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/zone.h"
                   ,0x1b2,"size != 0");
      }
      if (uVar3 < 0x41) {
        if (uVar3 < 0x11) {
          uVar3 = (uint)(uVar5 * 8 + 0x1fffffffff >> 5);
        }
        else {
          uVar3 = (int)(uVar5 * 8 + 0x3fffffff7f >> 6) + 4;
        }
        p->next = pZVar1->_slots[uVar3];
        pZVar1->_slots[uVar3] = p;
      }
      else {
        ZoneHeap::_releaseDynamic(pZVar1,p,size);
      }
    }
    this->_bucketsCount = newCount;
    this->_bucketsGrow = (newCount * 9) / 10;
    this->_data = ppZVar4;
  }
  return;
}

Assistant:

void ZoneHashBase::_rehash(uint32_t newCount) noexcept {
  ASMJIT_ASSERT(isInitialized());

  ZoneHashNode** oldData = _data;
  ZoneHashNode** newData = reinterpret_cast<ZoneHashNode**>(
    _heap->allocZeroed(static_cast<size_t>(newCount) * sizeof(ZoneHashNode*)));

  // We can still store nodes into the table, but it will degrade.
  if (ASMJIT_UNLIKELY(newData == nullptr))
    return;

  uint32_t i;
  uint32_t oldCount = _bucketsCount;

  for (i = 0; i < oldCount; i++) {
    ZoneHashNode* node = oldData[i];
    while (node) {
      ZoneHashNode* next = node->_hashNext;
      uint32_t hMod = node->_hVal % newCount;

      node->_hashNext = newData[hMod];
      newData[hMod] = node;

      node = next;
    }
  }

  // 90% is the maximum occupancy, can't overflow since the maximum capacity
  // is limited to the last prime number stored in the prime table.
  if (oldData != _embedded)
    _heap->release(oldData, _bucketsCount * sizeof(ZoneHashNode*));

  _bucketsCount = newCount;
  _bucketsGrow = newCount * 9 / 10;

  _data = newData;
}